

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O3

Value __thiscall jbcoin::STBase::getJson(STBase *this,int param_1)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined4 in_register_00000034;
  Value VVar3;
  long *local_28;
  uint local_20;
  long local_18 [2];
  
  (**(code **)(*(long *)CONCAT44(in_register_00000034,param_1) + 0x30))(&local_28);
  *(ushort *)&this->fName = (ushort)*(undefined4 *)&this->fName & 0xfe00 | 0x104;
  Json::valueAllocator();
  iVar1 = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                    (Json::valueAllocator::valueAllocator,local_28,(ulong)local_20);
  this->_vptr_STBase = (_func_int **)CONCAT44(extraout_var,iVar1);
  uVar2 = extraout_RDX;
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
    uVar2 = extraout_RDX_00;
  }
  VVar3._8_8_ = uVar2;
  VVar3.value_.map_ = (ObjectValues *)this;
  return VVar3;
}

Assistant:

Json::Value
STBase::getJson (int /*options*/) const
{
    return getText();
}